

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O3

void x25519_ge_scalarmult(ge_p2 *r,uint8_t *scalar,ge_p3 *A)

{
  byte bVar1;
  ulong uVar2;
  undefined8 *puVar3;
  long lVar4;
  ge_p2 *r_00;
  long lVar5;
  ge_p2 *p;
  uint uVar6;
  ge_cached *r_01;
  ulong uVar7;
  bool bVar8;
  ge_cached selected;
  ge_p3 u;
  ge_p1p1 t;
  ge_p2 Ai_p2 [8];
  ge_cached Ai [16];
  ge_cached local_fd8;
  ge_p3 local_f38;
  ge_p1p1 local_e98;
  ge_p2 local_d80;
  ge_p2 local_d08 [6];
  undefined8 local_a38;
  undefined8 local_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 local_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  ge_cached local_998;
  ge_cached local_8f8 [14];
  
  local_a30 = 0;
  uStack_a28 = 0;
  local_a20 = 0;
  uStack_a18 = 0;
  local_a38 = 1;
  local_a08 = 0;
  uStack_a00 = 0;
  local_9f8 = 0;
  uStack_9f0 = 0;
  local_a10 = 1;
  local_9e0 = 0;
  uStack_9d8 = 0;
  local_9d0 = 0;
  uStack_9c8 = 0;
  local_9e8 = 1;
  local_9c0 = 0;
  uStack_9b8 = 0;
  local_9b0 = 0;
  uStack_9a8 = 0;
  local_9a0 = 0;
  x25519_ge_p3_to_cached(&local_998,A);
  p = &local_d80;
  local_d80.X.v[4] = (A->X).v[4];
  local_d80.X.v[0] = (A->X).v[0];
  local_d80.X.v[1] = (A->X).v[1];
  local_d80.X.v[2] = (A->X).v[2];
  local_d80.X.v[3] = (A->X).v[3];
  local_d80.Y.v[0] = (A->Y).v[0];
  local_d80.Y.v[1] = (A->Y).v[1];
  local_d80.Y.v[2] = (A->Y).v[2];
  local_d80.Y.v[3] = (A->Y).v[3];
  local_d80.Y.v[4] = (A->Y).v[4];
  local_d80.Z.v[0] = (A->Z).v[0];
  local_d80.Z.v[1] = (A->Z).v[1];
  local_d80.Z.v[2] = (A->Z).v[2];
  local_d80.Z.v[3] = (A->Z).v[3];
  local_d80.Z.v[4] = (A->Z).v[4];
  r_01 = local_8f8;
  r_00 = local_d08;
  uVar7 = 0;
  do {
    uVar7 = uVar7 + 2;
    ge_p2_dbl(&local_e98,p);
    x25519_ge_p1p1_to_p3(&local_f38,&local_e98);
    x25519_ge_p3_to_cached(r_01,&local_f38);
    if (uVar7 < 8) {
      x25519_ge_p1p1_to_p2(r_00,&local_e98);
    }
    x25519_ge_add(&local_e98,A,r_01);
    x25519_ge_p1p1_to_p3(&local_f38,&local_e98);
    x25519_ge_p3_to_cached(r_01 + 1,&local_f38);
    if (uVar7 < 7) {
      x25519_ge_p1p1_to_p2(r_00 + 1,&local_e98);
    }
    r_01 = r_01 + 2;
    r_00 = r_00 + 2;
    p = p + 1;
  } while (uVar7 < 0xe);
  (r->X).v[2] = 0;
  (r->X).v[3] = 0;
  (r->X).v[0] = 0;
  (r->X).v[1] = 0;
  (r->X).v[4] = 0;
  (r->Y).v[1] = 0;
  (r->Y).v[2] = 0;
  (r->Y).v[3] = 0;
  (r->Y).v[4] = 0;
  (r->Y).v[0] = 1;
  (r->Z).v[1] = 0;
  (r->Z).v[2] = 0;
  (r->Z).v[3] = 0;
  (r->Z).v[4] = 0;
  (r->Z).v[0] = 1;
  uVar6 = 0;
  do {
    ge_p2_dbl(&local_e98,r);
    x25519_ge_p1p1_to_p2(r,&local_e98);
    ge_p2_dbl(&local_e98,r);
    x25519_ge_p1p1_to_p2(r,&local_e98);
    ge_p2_dbl(&local_e98,r);
    x25519_ge_p1p1_to_p2(r,&local_e98);
    ge_p2_dbl(&local_e98,r);
    x25519_ge_p1p1_to_p3(&local_f38,&local_e98);
    bVar1 = scalar[0x1f - (ulong)(uVar6 >> 3)];
    local_fd8.YplusX.v[3] = 0;
    local_fd8.YplusX.v[4] = 0;
    local_fd8.YplusX.v[1] = 0;
    local_fd8.YplusX.v[2] = 0;
    local_fd8.YplusX.v[0] = 1;
    local_fd8.YminusX.v[3] = 0;
    local_fd8.YminusX.v[4] = 0;
    local_fd8.YminusX.v[1] = 0;
    local_fd8.YminusX.v[2] = 0;
    local_fd8.YminusX.v[0] = 1;
    local_fd8.Z.v[3] = 0;
    local_fd8.Z.v[4] = 0;
    local_fd8.Z.v[1] = 0;
    local_fd8.Z.v[2] = 0;
    local_fd8.Z.v[0] = 1;
    local_fd8.T2d.v[2] = 0;
    local_fd8.T2d.v[3] = 0;
    local_fd8.T2d.v[0] = 0;
    local_fd8.T2d.v[1] = 0;
    local_fd8.T2d.v[4] = 0;
    puVar3 = &local_a38;
    lVar4 = 0;
    do {
      uVar7 = (long)((ulong)(bVar1 >> (~(byte)uVar6 & 4) & 0xf ^ (uint)lVar4) - 1) >> 0x3f;
      lVar5 = 0;
      do {
        uVar2 = local_fd8.YplusX.v[lVar5];
        local_fd8.YplusX.v[lVar5] = (puVar3[lVar5] ^ uVar2) & uVar7 ^ uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 5);
      lVar5 = 5;
      do {
        uVar2 = local_fd8.YplusX.v[lVar5];
        local_fd8.YplusX.v[lVar5] = (puVar3[lVar5] ^ uVar2) & uVar7 ^ uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 10);
      lVar5 = 10;
      do {
        uVar2 = local_fd8.YplusX.v[lVar5];
        local_fd8.YplusX.v[lVar5] = (puVar3[lVar5] ^ uVar2) & uVar7 ^ uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0xf);
      lVar5 = 0xf;
      do {
        uVar2 = local_fd8.YplusX.v[lVar5];
        local_fd8.YplusX.v[lVar5] = (puVar3[lVar5] ^ uVar2) & uVar7 ^ uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x14);
      lVar4 = lVar4 + 1;
      puVar3 = puVar3 + 0x14;
    } while (lVar4 != 0x10);
    x25519_ge_add(&local_e98,&local_f38,&local_fd8);
    x25519_ge_p1p1_to_p2(r,&local_e98);
    bVar8 = uVar6 < 0xfc;
    uVar6 = uVar6 + 4;
  } while (bVar8);
  return;
}

Assistant:

void x25519_ge_scalarmult(ge_p2 *r, const uint8_t *scalar, const ge_p3 *A) {
  ge_p2 Ai_p2[8];
  ge_cached Ai[16];
  ge_p1p1 t;

  ge_cached_0(&Ai[0]);
  x25519_ge_p3_to_cached(&Ai[1], A);
  ge_p3_to_p2(&Ai_p2[1], A);

  unsigned i;
  for (i = 2; i < 16; i += 2) {
    ge_p2_dbl(&t, &Ai_p2[i / 2]);
    ge_p1p1_to_cached(&Ai[i], &t);
    if (i < 8) {
      x25519_ge_p1p1_to_p2(&Ai_p2[i], &t);
    }
    x25519_ge_add(&t, A, &Ai[i]);
    ge_p1p1_to_cached(&Ai[i + 1], &t);
    if (i < 7) {
      x25519_ge_p1p1_to_p2(&Ai_p2[i + 1], &t);
    }
  }

  ge_p2_0(r);
  ge_p3 u;

  for (i = 0; i < 256; i += 4) {
    ge_p2_dbl(&t, r);
    x25519_ge_p1p1_to_p2(r, &t);
    ge_p2_dbl(&t, r);
    x25519_ge_p1p1_to_p2(r, &t);
    ge_p2_dbl(&t, r);
    x25519_ge_p1p1_to_p2(r, &t);
    ge_p2_dbl(&t, r);
    x25519_ge_p1p1_to_p3(&u, &t);

    uint8_t index = scalar[31 - i / 8];
    index >>= 4 - (i & 4);
    index &= 0xf;

    unsigned j;
    ge_cached selected;
    ge_cached_0(&selected);
    for (j = 0; j < 16; j++) {
      cmov_cached(&selected, &Ai[j], 1 & constant_time_eq_w(index, j));
    }

    x25519_ge_add(&t, &u, &selected);
    x25519_ge_p1p1_to_p2(r, &t);
  }
}